

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
notch::io::CSVReader::readCSVRow
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,CSVReader *this,string *row)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  int iVar4;
  size_type sVar5;
  long lVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator local_5a;
  allocator_type local_59;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&local_50,"",&local_5a);
  __l._M_len = 1;
  __l._M_array = &local_50;
  local_58 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__;
  core::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,__l,&local_59);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar2 = (row->_M_dataplus)._M_p;
  sVar3 = row->_M_string_length;
  sVar5 = 0;
  lVar6 = 0;
  iVar4 = 0;
  do {
    if (sVar3 == sVar5) {
      return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_58;
    }
    cVar1 = pcVar2[sVar5];
    if (iVar4 == 2) {
      if (cVar1 == this->delimiter) {
        std::__cxx11::string::string((string *)&local_50,"",&local_5a);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_58,&local_50);
LAB_0011d394:
        std::__cxx11::string::~string((string *)&local_50);
        lVar6 = lVar6 + 1;
      }
      else if (cVar1 == '\"') goto LAB_0011d3a8;
LAB_0011d3e5:
      iVar4 = 0;
    }
    else if (iVar4 == 1) {
      if (cVar1 == '\"') {
        iVar4 = 2;
      }
      else {
LAB_0011d3a8:
        std::__cxx11::string::push_back((char)(lVar6 << 5) + (char)*(undefined8 *)local_58);
        iVar4 = 1;
      }
    }
    else {
      if (cVar1 == this->delimiter) {
        std::__cxx11::string::string((string *)&local_50,"",&local_5a);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_58,&local_50);
        goto LAB_0011d394;
      }
      if (cVar1 != '\"') {
        std::__cxx11::string::push_back((char)(lVar6 << 5) + (char)*(undefined8 *)local_58);
        goto LAB_0011d3e5;
      }
      iVar4 = 1;
    }
    sVar5 = sVar5 + 1;
  } while( true );
}

Assistant:

std::vector<std::string> readCSVRow(const std::string &row) {
        CSVReaderState state = CSVReaderState::UnquotedField;
        std::vector<std::string> fields {""};
        size_t i = 0; // index of the current field
        for (char c : row) {
            switch (state) {
                case CSVReaderState::UnquotedField:
                    if (c == delimiter) { // end of field
                          fields.push_back(""); i++;
                    } else if (c == '"') {
                        state = CSVReaderState::QuotedField;
                    } else {
                        fields[i].push_back(c);
                    }
                    break;
                case CSVReaderState::QuotedField:
                    if (c == '"') {
                        state = CSVReaderState::QuotedQuote;
                    } else {
                        fields[i].push_back(c);
                    }
                    break;
                case CSVReaderState::QuotedQuote:
                    if (c == delimiter) { // , after closing quote
                          fields.push_back(""); i++;
                          state = CSVReaderState::UnquotedField;
                    } else if (c == '"') { // "" -> "
                          fields[i].push_back('"');
                          state = CSVReaderState::QuotedField;
                    } else { // end of quote
                          state = CSVReaderState::UnquotedField;
                    }
                    break;
            }
        }
        return fields;
    }